

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpabortdescriptors.cpp
# Opt level: O3

int __thiscall jrtplib::RTPAbortDescriptors::ClearAbortSignal(RTPAbortDescriptors *this)

{
  int iVar1;
  uchar buf [1];
  int8_t local_22 [2];
  
  iVar1 = -0xae;
  if ((this->m_init == true) &&
     (iVar1 = RTPSelect(this->m_descriptors,local_22,1,(RTPTime)0x0), -1 < iVar1)) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPAbortDescriptors::ClearAbortSignal()
{
	if (!m_init)
		return ERR_RTP_ABORTDESC_NOTINIT;

	bool done = false;
	while (!done)
	{
		int8_t isset = 0;

		// Not used: struct timeval tv = { 0, 0 };

		int status = RTPSelect(&m_descriptors[0], &isset, 1, RTPTime(0));
		if (status < 0)
			return status;

		if (!isset)
			done = true;
		else
		{
			int status = ReadSignallingByte();
			if (status < 0)
				return status;
		}
	}

	return 0;
}